

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::CheckExtensionDeclaration
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto,
          string_view declared_full_name,string_view declared_type_name,bool is_repeated)

{
  byte bVar1;
  char *pcVar2;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  char cVar3;
  int iVar4;
  Nonnull<const_char_*> pcVar5;
  undefined8 extraout_RAX;
  bool v1;
  string_view element_name;
  string_view element_name_00;
  string actual_full_name;
  char local_e1;
  size_t local_e0;
  char *local_d8;
  VoidPtr local_d0;
  code *pcStack_c8;
  VoidPtr local_c0;
  code *pcStack_b8;
  string local_b0;
  FieldDescriptor *local_90;
  size_t *local_88;
  string *local_80;
  AlphaNum local_60;
  
  local_d8 = declared_full_name._M_str;
  local_e0 = declared_full_name._M_len;
  local_e1 = is_repeated;
  if (declared_type_name._M_len != 0) {
    CheckExtensionDeclarationFieldType(this,field,proto,declared_type_name);
  }
  if (local_e0 == 0) goto LAB_00168b7c;
  local_90 = (FieldDescriptor *)0x1;
  local_88 = (size_t *)0x32504d;
  pcVar2 = (field->all_names_).payload_;
  local_60.piece_._M_len = (size_t)*(ushort *)(pcVar2 + 2);
  local_60.piece_._M_str = pcVar2 + ~local_60.piece_._M_len;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_b0,(lts_20250127 *)&local_90,&local_60,(AlphaNum *)local_60.piece_._M_str);
  if (local_e0 == local_b0._M_string_length) {
    if (local_e0 != 0) {
      iVar4 = bcmp(local_d8,local_b0._M_dataplus._M_p,local_e0);
      if (iVar4 != 0) goto LAB_00168b11;
    }
  }
  else {
LAB_00168b11:
    pcVar2 = (field->all_names_).payload_;
    element_name._M_len = (ulong)*(ushort *)(pcVar2 + 2);
    element_name._M_str = pcVar2 + ~element_name._M_len;
    local_88 = &local_e0;
    pcStack_b8 = absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::CheckExtensionDeclaration(google::protobuf::FieldDescriptor_const&,google::protobuf::FieldDescriptorProto_const&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,bool)::__0,std::__cxx11::string>
    ;
    make_error.invoker_ =
         absl::lts_20250127::functional_internal::
         InvokeObject<google::protobuf::DescriptorBuilder::CheckExtensionDeclaration(google::protobuf::FieldDescriptor_const&,google::protobuf::FieldDescriptorProto_const&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,bool)::__0,std::__cxx11::string>
    ;
    make_error.ptr_.fun = (_func_void *)&local_90;
    local_c0.obj = &local_90;
    local_90 = field;
    local_80 = &local_b0;
    AddError(this,element_name,&proto->super_Message,EXTENDEE,make_error);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
LAB_00168b7c:
  cVar3 = local_e1;
  bVar1 = field->field_0x1;
  v1 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 == v1) {
    pcVar5 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (v1,0xbf < bVar1,
                        "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar5 == (Nonnull<const_char_*>)0x0) {
    if ((bool)cVar3 != (((byte)field->field_0x1 >> 5 & 1) != 0)) {
      pcVar2 = (field->all_names_).payload_;
      element_name_00._M_len = (ulong)*(ushort *)(pcVar2 + 2);
      element_name_00._M_str = pcVar2 + ~element_name_00._M_len;
      local_d0.obj = &local_90;
      local_88 = (size_t *)&local_e1;
      pcStack_c8 = absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::CheckExtensionDeclaration(google::protobuf::FieldDescriptor_const&,google::protobuf::FieldDescriptorProto_const&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,bool)::__1,std::__cxx11::string>
      ;
      make_error_00.invoker_ =
           absl::lts_20250127::functional_internal::
           InvokeObject<google::protobuf::DescriptorBuilder::CheckExtensionDeclaration(google::protobuf::FieldDescriptor_const&,google::protobuf::FieldDescriptorProto_const&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,bool)::__1,std::__cxx11::string>
      ;
      make_error_00.ptr_.obj = local_d0.obj;
      local_90 = field;
      AddError(this,element_name_00,&proto->super_Message,EXTENDEE,make_error_00);
    }
    return;
  }
  CheckExtensionDeclaration();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void DescriptorBuilder::CheckExtensionDeclaration(
    const FieldDescriptor& field, const FieldDescriptorProto& proto,
    absl::string_view declared_full_name, absl::string_view declared_type_name,
    bool is_repeated) {
  if (!declared_type_name.empty()) {
    CheckExtensionDeclarationFieldType(field, proto, declared_type_name);
  }
  if (!declared_full_name.empty()) {
    std::string actual_full_name = absl::StrCat(".", field.full_name());
    if (declared_full_name != actual_full_name) {
      AddError(field.full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE, [&] {
                 return absl::Substitute(
                     "\"$0\" extension field $1 is expected to have field name "
                     "\"$2\", not \"$3\".",
                     field.containing_type()->full_name(), field.number(),
                     declared_full_name, actual_full_name);
               });
    }
  }

  if (is_repeated != field.is_repeated()) {
    AddError(field.full_name(), proto, DescriptorPool::ErrorCollector::EXTENDEE,
             [&] {
               return absl::Substitute(
                   "\"$0\" extension field $1 is expected to be $2.",
                   field.containing_type()->full_name(), field.number(),
                   is_repeated ? "repeated" : "optional");
             });
  }
}